

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

int green_poller_release(green_poller_t poller)

{
  green_future_t *ppgVar1;
  green_future_t future;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  fwrite("green_poller_release()\n",0x17,1,_stderr);
  if (poller == (green_poller_t)0x0) {
    iVar3 = 1;
  }
  else {
    if (poller->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","poller->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x1b9);
      fflush(_stderr);
      abort();
    }
    iVar3 = 0;
    iVar2 = poller->refs + -1;
    poller->refs = iVar2;
    if (iVar2 == 0) {
      if (poller->used != 0) {
        uVar4 = 0;
        do {
          ppgVar1 = poller->futures;
          ppgVar1[uVar4]->poller = (green_poller_t)0x0;
          future = ppgVar1[uVar4];
          future->slot = -1;
          green_future_release(future);
          poller->futures[uVar4] = (green_future_t)0x0;
          uVar4 = uVar4 + 1;
        } while (uVar4 < poller->used);
      }
      free(poller->futures);
      free(poller);
    }
  }
  return iVar3;
}

Assistant:

int green_poller_release(green_poller_t poller)
{
    fprintf(stderr, "green_poller_release()\n");

    if (poller == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(poller->refs > 0);
    if (--poller->refs == 0) {
        for (int i = 0; i < poller->used; ++i) {
            poller->futures[i]->poller = NULL;
            poller->futures[i]->slot = -1;
            green_future_release(poller->futures[i]);
            poller->futures[i] = NULL;
        }
        green_free(poller->futures);
        poller->futures = NULL;
        poller->loop = NULL;
        green_free(poller);
    }
    return GREEN_SUCCESS;
}